

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_retry_control.c
# Opt level: O3

time_t retry_get_tick_seconds(RETRY_CONTROL_INSTANCE *retry_control)

{
  int iVar1;
  ulong uVar2;
  tickcounter_ms_t tick;
  tickcounter_ms_t local_18;
  
  local_18 = 0;
  uVar2 = 0xffffffffffffffff;
  if (retry_control != (RETRY_CONTROL_INSTANCE *)0x0) {
    iVar1 = tickcounter_get_current_ms((TICK_COUNTER_HANDLE)retry_control,&local_18);
    if (local_18 != 0xffffffffffffffff && iVar1 == 0) {
      uVar2 = local_18 / 1000;
    }
  }
  return uVar2;
}

Assistant:

static time_t retry_get_tick_seconds(RETRY_CONTROL_INSTANCE* retry_control)
{
    time_t result = INDEFINITE_TIME;
    int tick_result;
    tickcounter_ms_t tick = 0;

    if (retry_control != NULL && retry_control->tick_counter != NULL)
    {
        tick_result = tickcounter_get_current_ms(retry_control->tick_counter, &tick);
        if (tick_result == 0 && INDEFINITE_TIME != tick)
        {
            // convert tick ms into secs
            result = (time_t)(tick / 1000); 
        }
    }

    return result;
}